

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_>::fastAccessDx
          (FadBinaryDiv<Fad<double>,_FadExpr<FadFuncCosh<Fad<double>_>_>_> *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar1 = (this->left_->dx_).ptr_to_data[i];
  dVar4 = cosh((this->right_->fadexpr_).expr_.val_);
  dVar2 = (this->right_->fadexpr_).expr_.dx_.ptr_to_data[i];
  dVar5 = sinh((this->right_->fadexpr_).expr_.val_);
  dVar3 = this->left_->val_;
  dVar6 = cosh((this->right_->fadexpr_).expr_.val_);
  dVar7 = cosh((this->right_->fadexpr_).expr_.val_);
  return (dVar4 * dVar1 - dVar5 * dVar2 * dVar3) / (dVar7 * dVar6);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}